

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall mario::EventLoop::loop(EventLoop *this)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  undefined4 extraout_var;
  reference ppCVar3;
  Writer *pWVar4;
  Channel *in_RCX;
  EventLoop *local_d0 [3];
  Writer local_b8;
  int64_t local_40;
  Channel *local_38;
  Channel *channel_p;
  iterator __end2;
  iterator __begin2;
  ChannelList *__range2;
  EventLoop *this_local;
  
  assertInLoopThread(this);
  this->_looping = true;
  this->_quit = false;
  while (iVar2 = (int)in_RCX, ((this->_quit ^ 0xffU) & 1) != 0) {
    std::vector<mario::Channel_*,_std::allocator<mario::Channel_*>_>::clear(&this->_activeChannels);
    this_00 = std::unique_ptr<mario::EPoller,_std::default_delete<mario::EPoller>_>::operator->
                        (&this->_poller);
    iVar2 = EPoller::poll(this_00,(pollfd *)0x2710,(nfds_t)&this->_activeChannels,iVar2);
    in_RCX = (Channel *)CONCAT44(extraout_var,iVar2);
    (this->_pollReturnTime)._microSecondsSinceEpoch = (int64_t)in_RCX;
    __end2 = std::vector<mario::Channel_*,_std::allocator<mario::Channel_*>_>::begin
                       (&this->_activeChannels);
    channel_p = (Channel *)
                std::vector<mario::Channel_*,_std::allocator<mario::Channel_*>_>::end
                          (&this->_activeChannels);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<mario::Channel_**,_std::vector<mario::Channel_*,_std::allocator<mario::Channel_*>_>_>
                                  *)&channel_p);
      if (!bVar1) break;
      ppCVar3 = __gnu_cxx::
                __normal_iterator<mario::Channel_**,_std::vector<mario::Channel_*,_std::allocator<mario::Channel_*>_>_>
                ::operator*(&__end2);
      in_RCX = *ppCVar3;
      local_40 = (this->_pollReturnTime)._microSecondsSinceEpoch;
      local_38 = in_RCX;
      Channel::handleEvent(in_RCX,(Timestamp)local_40);
      __gnu_cxx::
      __normal_iterator<mario::Channel_**,_std::vector<mario::Channel_*,_std::allocator<mario::Channel_*>_>_>
      ::operator++(&__end2);
    }
    doPendingFunctors(this);
  }
  el::base::Writer::Writer
            (&local_b8,Info,
             "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
             ,0x48,"void mario::EventLoop::loop()",NormalLog,0);
  pWVar4 = el::base::Writer::construct(&local_b8,1,el::base::consts::kDefaultLoggerId);
  pWVar4 = el::base::Writer::operator<<(pWVar4,(char (*) [10])"EventLoop");
  local_d0[0] = this;
  pWVar4 = el::base::Writer::operator<<(pWVar4,local_d0);
  el::base::Writer::operator<<(pWVar4,(char (*) [14])" stop looping");
  el::base::Writer::~Writer(&local_b8);
  this->_looping = false;
  return;
}

Assistant:

void EventLoop::loop() {
	assertInLoopThread();
	_looping = true;
    _quit = false;

    while (!_quit) {
        _activeChannels.clear();
        _pollReturnTime = _poller->poll(kPollTimeMs, &_activeChannels);
        for (auto channel_p : _activeChannels) {
            channel_p->handleEvent(_pollReturnTime);
        }

        doPendingFunctors();
    }

	LOG(INFO) << "EventLoop" << this << " stop looping";
	_looping = false;
}